

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdistancefield.cpp
# Opt level: O1

void __thiscall
QDistanceField::setGlyph(QDistanceField *this,QRawFont *font,glyph_t glyph,bool doubleResolution)

{
  QDistanceFieldData *pQVar1;
  int iVar2;
  undefined7 in_register_00000009;
  int iVar3;
  long in_FS_OFFSET;
  QPainterPath path;
  QRawFont renderFont;
  QRectF local_68;
  QRawFont local_48;
  QRawFont local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.d.d.ptr = (QExplicitlySharedDataPointer<QRawFontPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QRawFont::QRawFont(&local_40,font);
  initialDistanceFieldFactor();
  iVar3 = QT_DISTANCEFIELD_DEFAULT_BASEFONTSIZE;
  if ((int)CONCAT71(in_register_00000009,doubleResolution) != 0) {
    iVar3 = QT_DISTANCEFIELD_DEFAULT_BASEFONTSIZE * 2;
  }
  initialDistanceFieldFactor();
  iVar2 = QT_DISTANCEFIELD_DEFAULT_SCALE;
  if (doubleResolution) {
    iVar2 = QT_DISTANCEFIELD_DEFAULT_SCALE / 2;
  }
  QRawFont::setPixelSize(&local_40,(double)(iVar2 * iVar3));
  local_48.d.d.ptr = (QExplicitlySharedDataPointer<QRawFontPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QRawFont::pathForGlyph(&local_48,(quint32)&local_40);
  QPainterPath::boundingRect(&local_68,(QPainterPath *)&local_48);
  QPainterPath::translate((QPainterPath *)&local_48,-local_68.xp,-local_68.yp);
  QPainterPath::setFillRule((QPainterPath *)&local_48,WindingFill);
  pQVar1 = QDistanceFieldData::create((QPainterPath *)&local_48,doubleResolution);
  QSharedDataPointer<QDistanceFieldData>::reset(&this->d,pQVar1);
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 != (QDistanceFieldData *)0x0) &&
     ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1)) {
    QSharedDataPointer<QDistanceFieldData>::detach_helper(&this->d);
  }
  ((this->d).d.ptr)->glyph = glyph;
  QPainterPath::~QPainterPath((QPainterPath *)&local_48);
  QRawFont::~QRawFont(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDistanceField::setGlyph(const QRawFont &font, glyph_t glyph, bool doubleResolution)
{
    QRawFont renderFont = font;
    renderFont.setPixelSize(QT_DISTANCEFIELD_BASEFONTSIZE(doubleResolution) * QT_DISTANCEFIELD_SCALE(doubleResolution));

    QPainterPath path = renderFont.pathForGlyph(glyph);
    path.translate(-path.boundingRect().topLeft());
    path.setFillRule(Qt::WindingFill);

    d = QDistanceFieldData::create(path, doubleResolution);
    d->glyph = glyph;
}